

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

void __thiscall duckdb::Event::AddDependency(Event *this,Event *event)

{
  _Atomic_word *p_Var1;
  int iVar2;
  weak_ptr<duckdb::Event,_true> local_30;
  enable_shared_from_this<duckdb::Event> local_20;
  
  this->total_dependencies = this->total_dependencies + 1;
  enable_shared_from_this<duckdb::Event>::shared_from_this(&local_20);
  local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_20.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_20.__weak_this_.internal.
            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_weak_count + 1;
    }
  }
  ::std::
  vector<duckdb::weak_ptr<duckdb::Event,true>,std::allocator<duckdb::weak_ptr<duckdb::Event,true>>>
  ::emplace_back<duckdb::weak_ptr<duckdb::Event,true>>
            ((vector<duckdb::weak_ptr<duckdb::Event,true>,std::allocator<duckdb::weak_ptr<duckdb::Event,true>>>
              *)&event->parents,&local_30);
  if (local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_30.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_20.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.__weak_this_.internal.
               super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void Event::AddDependency(Event &event) {
	total_dependencies++;
	event.parents.push_back(weak_ptr<Event>(shared_from_this()));
#ifdef DEBUG
	event.parents_raw.push_back(*this);
#endif
}